

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

TPZVec<void_*> * __thiscall
TPZVec<void_*>::operator=(TPZVec<void_*> *this,initializer_list<void_*> *list)

{
  size_type sVar1;
  const_iterator ppvVar2;
  initializer_list<void_*> *in_RSI;
  TPZVec<void_*> *in_RDI;
  void **aux;
  const_iterator it_end;
  const_iterator it;
  void **local_28;
  const_iterator local_18;
  
  sVar1 = std::initializer_list<void_*>::size(in_RSI);
  (*in_RDI->_vptr_TPZVec[3])(in_RDI,sVar1);
  local_18 = std::initializer_list<void_*>::begin(in_RSI);
  ppvVar2 = std::initializer_list<void_*>::end((initializer_list<void_*> *)in_RDI);
  local_28 = in_RDI->fStore;
  for (; local_18 != ppvVar2; local_18 = local_18 + 1) {
    *local_28 = *local_18;
    local_28 = local_28 + 1;
  }
  return in_RDI;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const std::initializer_list<T> &list) {
	Resize(list.size());

	auto it = list.begin();
	auto it_end = list.end();
	auto *aux = fStore;

	for (; it != it_end; it++, aux++)
		*aux = *it;
	return *this;
}